

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,RE *regex,char *file,int line,
          DeathTest **test)

{
  InternalRunDeathTestFlag *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  DeathTest *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined8 uVar7;
  string local_110;
  int local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  DeathTest **local_88;
  RE *local_80;
  int local_74;
  undefined1 auStack_70 [4];
  int death_test_index;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88 = test;
  local_80 = regex;
  UnitTest::GetInstance();
  this_00 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  iVar2 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_;
  iVar3 = iVar2 + 1;
  ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_ = iVar3;
  local_74 = iVar3;
  if (this_00 != (InternalRunDeathTestFlag *)0x0) {
    if (this_00->index_ <= iVar2) {
      StreamableToString<int>(&local_110,&local_74);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_110,0,0,"Death test count (",0x12);
      local_e8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p == paVar5) {
        local_e8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_e8._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_e8,") somehow exceeded expected maximum (");
      paVar5 = &local_a8.field_2;
      local_a8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == paVar6) {
        local_a8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_a8._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_a8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_a8._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      local_ec = this_00->index_;
      StreamableToString<int>(&local_c8,&local_ec);
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar5) {
        uVar7 = local_a8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_c8._M_string_length + local_a8._M_string_length) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          uVar7 = local_c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_c8._M_string_length + local_a8._M_string_length) goto LAB_00177966;
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_c8,0,0,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      }
      else {
LAB_00177966:
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_a8,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if (paVar1 == paVar6) {
        local_50.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      }
      else {
        local_50.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_50._M_dataplus._M_p = (pointer)paVar1;
      }
      local_50._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      paVar6->_M_local_buf[0] = '\0';
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_50,")");
      _auStack_70 = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_auStack_70 == paVar6) {
        local_60._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_60._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        _auStack_70 = (pointer)&local_60;
      }
      else {
        local_60._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_68 = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &DeathTest::last_death_test_message__abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_auStack_70 != &local_60) {
        operator_delete(_auStack_70,local_60._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar5) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == &local_110.field_2) {
        return false;
      }
      goto LAB_00177b6b;
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this_00->file_,file);
    if (((iVar2 != 0) || (this_00->line_ != line)) || (this_00->index_ != iVar3)) {
      *local_88 = (DeathTest *)0x0;
      return true;
    }
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_death_test_style_abi_cxx11_,"threadsafe");
  if (iVar3 == 0) {
    this_01 = (DeathTest *)operator_new(0x40);
    DeathTest::DeathTest(this_01);
    this_01[1]._vptr_DeathTest = (_func_int **)statement;
    this_01[2]._vptr_DeathTest = (_func_int **)local_80;
    *(undefined1 *)&this_01[3]._vptr_DeathTest = 0;
    *(undefined8 *)((long)&this_01[3]._vptr_DeathTest + 4) = 0xffffffff;
    *(undefined8 *)((long)&this_01[4]._vptr_DeathTest + 4) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this_01[5]._vptr_DeathTest + 4) = 0xffffffff;
    this_01->_vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_0019e940;
    this_01[6]._vptr_DeathTest = (_func_int **)file;
    *(int *)&this_01[7]._vptr_DeathTest = line;
  }
  else {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       FLAGS_gtest_death_test_style_abi_cxx11_,"fast");
    if (iVar3 != 0) {
      std::operator+(&local_50,"Unknown death test style \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_death_test_style_abi_cxx11_);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_50,"\" encountered");
      _auStack_70 = (pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_auStack_70 == paVar5) {
        local_60._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_60._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        _auStack_70 = (pointer)&local_60;
      }
      else {
        local_60._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_68 = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &DeathTest::last_death_test_message__abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_auStack_70 != &local_60) {
        operator_delete(_auStack_70,local_60._M_allocated_capacity + 1);
      }
      local_110.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
      local_110._M_dataplus._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return false;
      }
LAB_00177b6b:
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      return false;
    }
    this_01 = (DeathTest *)operator_new(0x30);
    DeathTest::DeathTest(this_01);
    this_01[1]._vptr_DeathTest = (_func_int **)statement;
    this_01[2]._vptr_DeathTest = (_func_int **)local_80;
    *(undefined1 *)&this_01[3]._vptr_DeathTest = 0;
    *(undefined8 *)((long)&this_01[3]._vptr_DeathTest + 4) = 0xffffffff;
    *(undefined8 *)((long)&this_01[4]._vptr_DeathTest + 4) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this_01[5]._vptr_DeathTest + 4) = 0xffffffff;
    this_01->_vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_0019e8e8;
  }
  *local_88 = this_01;
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement, const RE* regex,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != NULL) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index)
          + ") somehow exceeded expected maximum ("
          + StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = NULL;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, regex, file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, regex, file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, regex);
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(
        "Unknown death test style \"" + GTEST_FLAG(death_test_style)
        + "\" encountered");
    return false;
  }